

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

void resistcham(void)

{
  monst *mtmp;
  uint uVar1;
  
  for (mtmp = level->monlist; mtmp != (monst *)0x0; mtmp = mtmp->nmon) {
    if (0 < mtmp->mhp) {
      uVar1 = *(uint *)&mtmp->field_0x60 >> 4 & 7;
      if (uVar1 != 0) {
        *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffffff8f;
        newcham(level,mtmp,mons + cham_to_pm[uVar1],'\0','\0');
      }
      if (((mtmp->data->mflags2 & 4) != 0) && (mtmp->data->mlet != '5')) {
        new_were(mtmp);
      }
      if ((mtmp->m_ap_type != '\0') && ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)) {
        seemimic(mtmp);
        mtmp->field_0x62 = mtmp->field_0x62 | 8;
      }
    }
  }
  return;
}

Assistant:

void resistcham(void)
{
	struct monst *mtmp;
	int mcham;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
		if (DEADMONSTER(mtmp)) continue;
		mcham = (int) mtmp->cham;
		if (mcham) {
			mtmp->cham = CHAM_ORDINARY;
			newcham(level, mtmp, &mons[cham_to_pm[mcham]],
				       FALSE, FALSE);
		}
		if (is_were(mtmp->data) && mtmp->data->mlet != S_HUMAN)
			new_were(mtmp);
		if (mtmp->m_ap_type && cansee(mtmp->mx, mtmp->my)) {
			seemimic(mtmp);
			/* we pretend that the mimic doesn't */
			/* know that it has been unmasked.   */
			mtmp->msleeping = 1;
		}
	}
}